

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

void __thiscall ExecutorX86::SaveListing(ExecutorX86 *this,OutputContext *output)

{
  byte bVar1;
  int iVar2;
  x86Instruction *this_00;
  uint *puVar3;
  ExternFuncInfo *pEVar4;
  RegVmCmd *pRVar5;
  byte *pbVar6;
  uint k;
  uint uVar7;
  uint uVar8;
  uint index;
  char *pcVar9;
  uint index_00;
  ulong uVar10;
  TraceScope traceScope;
  char instBuf [128];
  
  if ((SaveListing(OutputContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SaveListing(OutputContext&)::token), iVar2 != 0)) {
    SaveListing::token = NULLC::TraceGetToken("x86","SaveListing");
    __cxa_guard_release(&SaveListing(OutputContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,SaveListing::token);
  index = 0;
  do {
    if ((this->instList).count <= index) {
      OutputContext::Flush(output);
      NULLC::TraceScope::~TraceScope(&traceScope);
      return;
    }
    this_00 = FastVector<x86Instruction,_true,_true>::operator[](&this->instList,index);
    if (this_00->instID != 0) {
      uVar8 = this_00->instID - 1;
      puVar3 = FastVector<unsigned_int,_false,_false>::operator[](&this->codeJumpTargets,uVar8);
      if (*puVar3 != 0) {
        uVar7 = (this->exLinker->exFunctions).count;
        uVar10 = 0;
        for (index_00 = 0; uVar7 != index_00; index_00 = index_00 + 1) {
          pEVar4 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                             (&this->exLinker->exFunctions,index_00);
          if (pEVar4->regVmAddress == uVar8) {
            pcVar9 = (this->exLinker->exSymbols).data + pEVar4->offsetToName;
            uVar10 = (ulong)index_00;
            goto LAB_00140c2b;
          }
        }
        pcVar9 = (char *)0x0;
LAB_00140c2b:
        OutputContext::Print(output,"; ------------------- Invalidation ----------------\n");
        if (pcVar9 == (char *)0x0) {
          OutputContext::Printf(output,"0x%x: ; %4d",(ulong)(uVar8 | 0xc0000000),(ulong)uVar8);
        }
        else {
          OutputContext::Printf
                    (output,"0x%x: ; %4d // %s#%d",(ulong)(uVar8 | 0xc0000000),(ulong)uVar8,pcVar9,
                     uVar10);
        }
        OutputContext::Print(output,'\n');
      }
      if (uVar8 < this->exRegVmCode->count) {
        pRVar5 = FastVector<RegVmCmd,_false,_false>::operator[](this->exRegVmCode,uVar8);
        OutputContext::Printf(output,"; %4d: ",(ulong)uVar8);
        PrintInstruction(output,(char *)this->exRegVmConstants->data,this->exFunctions->data,
                         (this->exLinker->exSymbols).data,(uint)pRVar5->code,pRVar5->rA,pRVar5->rB,
                         pRVar5->rC,pRVar5->argument,(VmConstant *)0x0);
        puVar3 = FastVector<unsigned_int,_false,_false>::operator[]
                           (&this->codeRegKillInfoOffsets,uVar8);
        uVar8 = *puVar3;
        pbVar6 = FastVector<unsigned_char,_false,_false>::operator[](this->exRegVmRegKillInfo,uVar8)
        ;
        bVar1 = *pbVar6;
        if (bVar1 != 0) {
          OutputContext::Print(output," // kill");
          uVar8 = uVar8 + 1;
          if (0xf < bVar1) {
            OutputContext::Print(output," early[");
            for (uVar7 = 0; bVar1 >> 4 != uVar7; uVar7 = uVar7 + 1) {
              pcVar9 = ", ";
              if (uVar7 == 0) {
                pcVar9 = "";
              }
              pbVar6 = FastVector<unsigned_char,_false,_false>::operator[]
                                 (this->exRegVmRegKillInfo,uVar8 + uVar7);
              OutputContext::Printf(output,"%sr%d",pcVar9,(ulong)*pbVar6);
            }
            OutputContext::Print(output,']');
            uVar8 = uVar8 + uVar7;
          }
          if ((bVar1 & 0xf) != 0) {
            OutputContext::Print(output," late[");
            for (uVar7 = 0; (bVar1 & 0xf) != uVar7; uVar7 = uVar7 + 1) {
              pcVar9 = ", ";
              if (uVar7 == 0) {
                pcVar9 = "";
              }
              pbVar6 = FastVector<unsigned_char,_false,_false>::operator[]
                                 (this->exRegVmRegKillInfo,uVar7 + uVar8);
              OutputContext::Printf(output,"%sr%d",pcVar9,(ulong)*pbVar6);
            }
            OutputContext::Print(output,']');
          }
        }
        OutputContext::Print(output,'\n');
      }
    }
    x86Instruction::Decode(this_00,&this->vmState,instBuf,0x80);
    OutputContext::Print(output,instBuf);
    OutputContext::Print(output,'\n');
    index = index + 1;
  } while( true );
}

Assistant:

void ExecutorX86::SaveListing(OutputContext &output)
{
	TRACE_SCOPE("x86", "SaveListing");

	const unsigned instBufSize = 128;
	char instBuf[instBufSize];

	for(unsigned i = 0; i < instList.size(); i++)
	{
		x86Instruction &inst = instList[i];

		unsigned instID = inst.instID;

		if(instID && codeJumpTargets[instID - 1])
		{
			const char *functionName = NULL;
			unsigned functionId = 0;

			for(unsigned k = 0, e = exLinker->exFunctions.size(); k != e; k++)
			{
				ExternFuncInfo &funcInfo = exLinker->exFunctions[k];

				if(unsigned(funcInfo.regVmAddress) == instID - 1)
				{
					functionName = funcInfo.offsetToName + exLinker->exSymbols.data;
					functionId = k;
					break;
				}
			}

			output.Print("; ------------------- Invalidation ----------------\n");

			if(functionName)
				output.Printf("0x%x: ; %4d // %s#%d", 0xc0000000 | (instID - 1), instID - 1, functionName, functionId);
			else
				output.Printf("0x%x: ; %4d", 0xc0000000 | (instID - 1), instID - 1);

			output.Print('\n');
		}

		if(instID && instID - 1 < exRegVmCode.size())
		{
			RegVmCmd &cmd = exRegVmCode[instID - 1];

			output.Printf("; %4d: ", instID - 1);

			PrintInstruction(output, (char*)exRegVmConstants.data, exFunctions.data, exLinker->exSymbols.data, RegVmInstructionCode(cmd.code), cmd.rA, cmd.rB, cmd.rC, cmd.argument, NULL);

			unsigned regKillInfoOffset = codeRegKillInfoOffsets[instID - 1];
			unsigned regKillCounts = exRegVmRegKillInfo[regKillInfoOffset];

			if(regKillCounts)
			{
				output.Print(" // kill");

				regKillInfoOffset++;

				unsigned preKillCount = (regKillCounts >> 4);
				unsigned postKillCount = (regKillCounts & 0xf);

				if(preKillCount)
				{
					output.Print(" early[");

					for(unsigned k = 0; k < preKillCount; k++)
						output.Printf("%sr%d", k == 0 ? "" : ", ", exRegVmRegKillInfo[regKillInfoOffset++]);

					output.Print(']');
				}

				if(postKillCount)
				{
					output.Print(" late[");

					for(unsigned k = 0; k < postKillCount; k++)
						output.Printf("%sr%d", k == 0 ? "" : ", ", exRegVmRegKillInfo[regKillInfoOffset++]);

					output.Print(']');
				}
			}

			output.Print('\n');
		}

		inst.Decode(vmState, instBuf, instBufSize);

		output.Print(instBuf);
		output.Print('\n');
	}

	output.Flush();
}